

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_uuid_link(intptr_t uuid,void *obj,_func_void_void_ptr *on_close)

{
  fio_uuid_links_s *set;
  long *plVar1;
  char *pcVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  fio_data_s *pfVar8;
  fio_uuid_links__map_s_ *pfVar9;
  int *piVar10;
  fio_uuid_links__ordered_s_ *pfVar11;
  fio_uuid_link_fn obj_00;
  fio_uuid_link_fn extraout_RDX;
  long lVar12;
  uint uVar13;
  ulong hash_value;
  long lVar14;
  fio_lock_i ret_1;
  fio_lock_i ret;
  
  if (uuid < 0) {
LAB_001268f7:
    piVar10 = __errno_location();
    *piVar10 = 9;
    (*on_close)(obj);
    return;
  }
  uVar13 = (uint)((ulong)uuid >> 8);
  if (fio_data->capa <= uVar13) goto LAB_001268f7;
  lVar14 = (long)(int)uVar13 * 0xa8;
  cVar3 = *(char *)((long)fio_data + lVar14 + 0x6d);
  if (cVar3 != (char)uuid) goto LAB_001268f7;
  fio_lock((fio_lock_i *)((long)fio_data + lVar14 + 0x6e));
  pfVar8 = fio_data;
  if ((fio_data->capa <= uVar13) || (*(char *)((long)fio_data + lVar14 + 0x6d) != cVar3)) {
    LOCK();
    *(undefined1 *)((long)fio_data + lVar14 + 0x6e) = 0;
    UNLOCK();
    goto LAB_001268f7;
  }
  set = (fio_uuid_links_s *)((long)fio_data + lVar14 + 0xb8);
  hash_value = -(ulong)(obj == (void *)0x0) | (ulong)obj;
  uVar4 = *(ulong *)((long)fio_data + lVar14 + 0xb8);
  uVar5 = *(ulong *)((long)fio_data + lVar14 + 200);
  obj_00 = (fio_uuid_link_fn)(uVar5 - uVar4);
  if (obj_00 <= (fio_uuid_link_fn)(uVar4 >> 1)) {
    if (uVar5 < *(ulong *)((long)fio_data + lVar14 + 0xc0)) goto LAB_0012689c;
    pcVar2 = (char *)((long)fio_data + lVar14 + 0xe1);
    *pcVar2 = *pcVar2 + '\x01';
  }
  fio_uuid_links_rehash(set);
  obj_00 = extraout_RDX;
LAB_0012689c:
  pfVar9 = fio_uuid_links__find_map_pos_(set,hash_value,obj_00);
  if (pfVar9 == (fio_uuid_links__map_s_ *)0x0) {
    lVar6 = *(long *)((long)pfVar8 + lVar14 + 200);
    lVar7 = *(long *)((long)pfVar8 + lVar14 + 0xd0);
    lVar12 = lVar6 * 0x10;
    *(_func_void_void_ptr **)(lVar7 + 8 + lVar12) = on_close;
    *(ulong *)(lVar7 + lVar12) = hash_value;
    *(long *)((long)pfVar8 + lVar14 + 200) = lVar6 + 1;
    plVar1 = (long *)((long)pfVar8 + lVar14 + 0xb8);
    *plVar1 = *plVar1 + 1;
    fio_uuid_links_rehash(set);
  }
  else {
    pfVar11 = pfVar9->pos;
    if (pfVar11 == (fio_uuid_links__ordered_s_ *)0x0) {
      lVar6 = *(long *)((long)pfVar8 + lVar14 + 200);
      pfVar11 = (fio_uuid_links__ordered_s_ *)
                (lVar6 * 0x10 + *(long *)((long)pfVar8 + lVar14 + 0xd0));
      pfVar9->pos = pfVar11;
      *(long *)((long)pfVar8 + lVar14 + 200) = lVar6 + 1;
      plVar1 = (long *)((long)pfVar8 + lVar14 + 0xb8);
      *plVar1 = *plVar1 + 1;
    }
    pfVar9->hash = hash_value;
    pfVar11->hash = hash_value;
    pfVar11->obj = on_close;
  }
  LOCK();
  *(undefined1 *)((long)fio_data + lVar14 + 0x6e) = 0;
  UNLOCK();
  return;
}

Assistant:

void fio_uuid_link(intptr_t uuid, void *obj, void (*on_close)(void *obj)) {
  if (!uuid_is_valid(uuid))
    goto invalid;
  fio_lock(&uuid_data(uuid).sock_lock);
  if (!uuid_is_valid(uuid))
    goto locked_invalid;
  fio_uuid_links_overwrite(&uuid_data(uuid).links, (uintptr_t)obj, on_close,
                           NULL);
  fio_unlock(&uuid_data(uuid).sock_lock);
  return;
locked_invalid:
  fio_unlock(&uuid_data(uuid).sock_lock);
invalid:
  errno = EBADF;
  on_close(obj);
}